

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O2

void __thiscall FMaskCVar::SetGenericRepDefault(FMaskCVar *this,UCVarValue value,ECVarType type)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  ECVarType dummy;
  
  iVar2 = FBaseCVar::ToInt(value,type);
  iVar1 = this->BitNum;
  uVar3 = (*(this->ValueVar->super_FBaseCVar)._vptr_FBaseCVar[7])(this->ValueVar,&dummy);
  (*(this->ValueVar->super_FBaseCVar)._vptr_FBaseCVar[8])
            (this->ValueVar,
             CONCAT44(extraout_var,~this->BitVal & uVar3 | iVar2 << ((byte)iVar1 & 0x1f)),1);
  return;
}

Assistant:

void FMaskCVar::SetGenericRepDefault (UCVarValue value, ECVarType type)
{
	int val = ToInt(value, type) << BitNum;
	ECVarType dummy;
	UCVarValue def;
	def = ValueVar.GetFavoriteRepDefault (&dummy);
	def.Int &= ~BitVal;
	def.Int |= val;
	ValueVar.SetGenericRepDefault (def, CVAR_Int);
}